

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O2

void __thiscall
HACD::WuColorQuantizer::Quantize
          (WuColorQuantizer *this,HaI32 PaletteSize,Vec3Vector *outputVertices)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  HaI32 HVar7;
  uint uVar8;
  HaU8 *tag;
  long lVar9;
  uint uVar10;
  uint uVar11;
  WuColorQuantizer *this_00;
  Box *cube;
  ulong uVar12;
  undefined1 auVar13 [16];
  HaF32 HVar14;
  HaF32 HVar15;
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  Vec3 local_8058;
  uint local_8048;
  int iStack_8044;
  int iStack_8040;
  int iStack_803c;
  HaF32 vv [1024];
  Box local_7038 [1024];
  
  uVar8 = 0x400;
  if (PaletteSize < 0x400) {
    uVar8 = PaletteSize;
  }
  M3D(this,this->mWeight,this->mSumX,this->mSumY,this->mSumZ,this->mSumSquared);
  local_7038[0]._8_8_ = 0x2000000000;
  local_7038[0]._0_8_ = 0x2000000000;
  local_7038[0].b0 = 0;
  local_7038[0].b1 = 0x20;
  iVar6 = 0;
  uVar10 = 1;
  do {
    uVar11 = uVar8;
    if ((int)uVar8 <= (int)uVar10) break;
    bVar5 = Cut(this,local_7038 + iVar6,local_7038 + (int)uVar10);
    if (bVar5) {
      HVar14 = 0.0;
      if (1 < local_7038[iVar6].vol) {
        HVar14 = Var(this,local_7038 + iVar6);
      }
      HVar15 = 0.0;
      iVar1 = local_7038[(int)uVar10].vol;
      vv[iVar6] = HVar14;
      if (1 < iVar1) {
        HVar15 = Var(this,local_7038 + (int)uVar10);
      }
      vv[(int)uVar10] = HVar15;
    }
    else {
      vv[iVar6] = 0.0;
      uVar10 = uVar10 - 1;
    }
    auVar17 = ZEXT464((uint)vv[0]);
    iVar6 = 0;
    for (lVar9 = 1; fVar16 = auVar17._0_4_, lVar9 - (ulong)(~((int)uVar10 >> 0x1f) & uVar10) != 1;
        lVar9 = lVar9 + 1) {
      auVar13 = vmaxss_avx(ZEXT416((uint)vv[lVar9]),auVar17._0_16_);
      auVar17 = ZEXT1664(auVar13);
      if (fVar16 < (float)vv[lVar9]) {
        iVar6 = (int)lVar9;
      }
    }
    uVar11 = uVar10 + 1;
    uVar10 = uVar11;
  } while (0.0 < fVar16);
  free(this->mSumSquared);
  this->mSumSquared = (HaF32 *)0x0;
  this_00 = (WuColorQuantizer *)0x1;
  tag = (HaU8 *)calloc(1,0x8c61);
  cube = local_7038;
  uVar12 = 0;
  do {
    if ((~((int)uVar11 >> 0x1f) & uVar11) == uVar12) {
      return;
    }
    Mark(this_00,cube,(HaI32)uVar12,tag);
    HVar7 = Vol(this_00,cube,this->mWeight);
    if (HVar7 != 0) {
      uVar8 = Vol(this_00,cube,this->mSumX);
      fVar16 = (float)HVar7;
      HVar7 = Vol(this_00,cube,this->mSumY);
      auVar18._4_4_ = fVar16;
      auVar18._0_4_ = fVar16;
      auVar18._8_4_ = fVar16;
      auVar18._12_4_ = fVar16;
      auVar13 = vpinsrd_avx(ZEXT416(uVar8),HVar7,1);
      auVar13 = vcvtdq2ps_avx(auVar13);
      auVar13 = vdivps_avx(auVar13,auVar18);
      auVar2._8_4_ = 0x3f000000;
      auVar2._0_8_ = 0x3f0000003f000000;
      auVar2._12_4_ = 0x3f000000;
      auVar13 = vaddps_avx512vl(auVar13,auVar2);
      iStack_8044 = (int)auVar13._4_4_;
      iStack_8040 = (int)auVar13._8_4_;
      iStack_803c = (int)auVar13._12_4_;
      local_8048 = (int)auVar13._0_4_;
      HVar7 = Vol(this_00,cube,this->mSumZ);
      if (0xff < (uint)(int)auVar13._0_4_) {
        __assert_fail("red >= 0 && red < 256",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x250,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
      }
      auVar13._4_4_ = iStack_8044;
      auVar13._0_4_ = local_8048;
      auVar13._8_4_ = iStack_8040;
      auVar13._12_4_ = iStack_803c;
      uVar8 = vextractps_avx(auVar13,1);
      if (0xff < uVar8) {
        __assert_fail("green >= 0 && green < 256",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x251,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
      }
      uVar8 = (uint)((float)HVar7 / fVar16 + 0.5);
      if (0xff < uVar8) {
        __assert_fail("blue >= 0 && blue < 256",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x252,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
      }
      auVar13 = vcvtudq2ps_avx512vl(auVar13);
      auVar3._8_4_ = 0xc3000000;
      auVar3._0_8_ = 0xc3000000c3000000;
      auVar3._12_4_ = 0xc3000000;
      auVar13 = vaddps_avx512vl(auVar13,auVar3);
      auVar4._8_4_ = 0x3c000000;
      auVar4._0_8_ = 0x3c0000003c000000;
      auVar4._12_4_ = 0x3c000000;
      auVar13 = vmulps_avx512vl(auVar13,auVar4);
      local_8058._0_8_ = vmovlps_avx(auVar13);
      local_8058.z = (HaF32)(((float)(int)uVar8 + -128.0) * 0.0078125);
      this_00 = (WuColorQuantizer *)outputVertices;
      hacd::vector<HACD::Vec3>::push_back(outputVertices,&local_8058);
    }
    uVar12 = uVar12 + 1;
    cube = cube + 1;
  } while( true );
}

Assistant:

void WuColorQuantizer::Quantize(HaI32 PaletteSize,Vec3Vector &outputVertices) 
{
	HaU8 *tag = NULL;

	if ( PaletteSize > MAXCOLOR )
	{
		PaletteSize = MAXCOLOR;
	}
	Box	cube[MAXCOLOR];
	HaI32	next;
	HaI32 i, weight;
	HaI32 k;
	HaF32 vv[MAXCOLOR], temp;

	// Compute moments
	M3D(mWeight, mSumX, mSumY, mSumZ, mSumSquared);

	cube[0].r0 = cube[0].g0 = cube[0].b0 = 0;
	cube[0].r1 = cube[0].g1 = cube[0].b1 = 32;
	next = 0;

	for (i = 1; i < PaletteSize; i++) 
	{
		if(Cut(&cube[next], &cube[i])) 
		{
			// volume test ensures we won't try to cut one-cell box
			vv[next] = (cube[next].vol > 1) ? Var(&cube[next]) : 0;
			vv[i] = (cube[i].vol > 1) ? Var(&cube[i]) : 0;
		} 
		else 
		{
			vv[next] = 0.0;   // don't try to split this box again
			i--;              // didn't create box i
		}

		next = 0; temp = vv[0];

		for (k = 1; k <= i; k++) 
		{
			if (vv[k] > temp) 
			{
				temp = vv[k]; next = k;
			}
		}

		if (temp <= 0.0) 
		{
			PaletteSize = i + 1;
			// Error: "Only got 'PaletteSize' boxes"
			break;
		}
	}

	// Partition done
	// the space for array mSumSquared can be freed now
	free(mSumSquared);
	mSumSquared = NULL;

	// create an optimized palette
	tag = (HaU8*) malloc(SIZE_3D * sizeof(HaU8));
	memset(tag, 0, SIZE_3D * sizeof(HaU8));

	for (k = 0; k < PaletteSize ; k++) 
	{
		Mark(&cube[k], k, tag);
		weight = Vol(&cube[k], mWeight);

		if (weight) 
		{
			HaI32 red	= (HaI32)(((HaF32)Vol(&cube[k], mSumX) / (HaF32)weight) + 0.5f);
			HaI32 green = (HaI32)(((HaF32)Vol(&cube[k], mSumY) / (HaF32)weight) + 0.5f);
			HaI32 blue	= (HaI32)(((HaF32)Vol(&cube[k], mSumZ) / (HaF32)weight) + 0.5f);
			HACD_ASSERT( red >= 0 && red < 256 );
			HACD_ASSERT( green >= 0 && green < 256 );
			HACD_ASSERT( blue >= 0 && blue < 256 );
			Vec3 v;
			v.x = (red-128.0f)/128.0f;
			v.y = (green-128.0f)/128.0f;
			v.z = (blue-128.0f)/128.0f;
			outputVertices.push_back(v);
		} 
		else 
		{
		}
	}
}